

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmobj.cpp
# Opt level: O1

void __thiscall CVmObjTable::delete_entry(CVmObjTable *this,vm_obj_id_t id,CVmObjPageEntry *entry)

{
  uint uVar1;
  
  *(ushort *)&entry->field_0x14 = ((ushort)*(undefined4 *)&entry->field_0x14 & 0xfffc) + 1;
  (**(code **)(*(long *)&entry->ptr_ + 0x10))(entry,0);
  if ((entry->field_0x15 & 1) != 0) {
    remove_post_load_init(this,id);
  }
  entry->next_obj_ = this->first_free_;
  uVar1 = this->first_free_;
  if (uVar1 != 0) {
    this->pages_[uVar1 >> 0xc][uVar1 & 0xfff].ptr_.prev_free_ = id;
  }
  (entry->ptr_).prev_free_ = 0;
  this->first_free_ = id;
  return;
}

Assistant:

void CVmObjTable::delete_entry(VMG_ vm_obj_id_t id, CVmObjPageEntry *entry)
{
    /* mark the object table entry as free */
    entry->free_ = TRUE;

    /* it's not in the root set if it's free */
    entry->in_root_set_ = FALSE;

    /* 
     *   notify the object that it's being deleted - this will let the
     *   object release any additional resources (such as variable-size
     *   heap space) that it's holding 
     */
    entry->get_vm_obj()->notify_delete(vmg_ FALSE);

    /* 
     *   remove any post-load initialization request for the object, if it
     *   ever requested post-load initialization 
     */
    if (entry->requested_post_load_init_)
        remove_post_load_init(id);

    /* link this object into the head of the free list */
    entry->next_obj_ = first_free_;

    /* link the previous head back to this object */
    if (first_free_ != VM_INVALID_OBJ)
        get_entry(first_free_)->ptr_.prev_free_ = id;

    /* this object doesn't have a previous entry */
    entry->ptr_.prev_free_ = VM_INVALID_OBJ;
    
    /* it's now the first entry in the list */
    first_free_ = id;
}